

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O0

bool MyGame::Example::operator==(Vec3 *lhs,Vec3 *rhs)

{
  Color CVar1;
  Color CVar2;
  Test *lhs_00;
  Test *rhs_00;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  undefined1 local_19;
  Vec3 *rhs_local;
  Vec3 *lhs_local;
  
  fVar3 = Vec3::x(lhs);
  fVar4 = Vec3::x(rhs);
  local_19 = false;
  if ((fVar3 == fVar4) && (!NAN(fVar3) && !NAN(fVar4))) {
    fVar3 = Vec3::y(lhs);
    fVar4 = Vec3::y(rhs);
    local_19 = false;
    if ((fVar3 == fVar4) && (!NAN(fVar3) && !NAN(fVar4))) {
      fVar3 = Vec3::z(lhs);
      fVar4 = Vec3::z(rhs);
      local_19 = false;
      if ((fVar3 == fVar4) && (!NAN(fVar3) && !NAN(fVar4))) {
        dVar5 = Vec3::test1(lhs);
        dVar6 = Vec3::test1(rhs);
        local_19 = false;
        if ((dVar5 == dVar6) && (!NAN(dVar5) && !NAN(dVar6))) {
          CVar1 = Vec3::test2(lhs);
          CVar2 = Vec3::test2(rhs);
          local_19 = false;
          if (CVar1 == CVar2) {
            lhs_00 = Vec3::test3(lhs);
            rhs_00 = Vec3::test3(rhs);
            local_19 = operator==(lhs_00,rhs_00);
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

inline bool operator==(const Vec3 &lhs, const Vec3 &rhs) {
  return
      (lhs.x() == rhs.x()) &&
      (lhs.y() == rhs.y()) &&
      (lhs.z() == rhs.z()) &&
      (lhs.test1() == rhs.test1()) &&
      (lhs.test2() == rhs.test2()) &&
      (lhs.test3() == rhs.test3());
}